

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O1

void __thiscall cmFileInstaller::DefaultFilePermissions(cmFileInstaller *this)

{
  mode_t *pmVar1;
  int iVar2;
  cmMakefile *this_00;
  bool bVar3;
  string local_48;
  
  cmFileCopier::DefaultFilePermissions(&this->super_cmFileCopier);
  iVar2 = *(int *)&(this->super_cmFileCopier).field_0xf4;
  if (iVar2 - 2U < 2) {
    this_00 = (this->super_cmFileCopier).Makefile;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"CMAKE_INSTALL_SO_NO_EXE","");
    bVar3 = cmMakefile::IsOn(this_00,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      return;
    }
  }
  else if ((iVar2 != 0) && (iVar2 != 5)) {
    return;
  }
  pmVar1 = &(this->super_cmFileCopier).FilePermissions;
  *(byte *)pmVar1 = (byte)*pmVar1 | 0x49;
  return;
}

Assistant:

void cmFileInstaller::DefaultFilePermissions()
{
  this->cmFileCopier::DefaultFilePermissions();
  // Add execute permissions based on the target type.
  switch (this->InstallType) {
    case cmInstallType_SHARED_LIBRARY:
    case cmInstallType_MODULE_LIBRARY:
      if (this->Makefile->IsOn("CMAKE_INSTALL_SO_NO_EXE")) {
        break;
      }
      CM_FALLTHROUGH;
    case cmInstallType_EXECUTABLE:
    case cmInstallType_PROGRAMS:
      this->FilePermissions |= mode_owner_execute;
      this->FilePermissions |= mode_group_execute;
      this->FilePermissions |= mode_world_execute;
      break;
    default:
      break;
  }
}